

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * ot::commissioner::ToHex<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short aInteger)

{
  ByteArray *aBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38;
  unsigned_short local_12;
  string *psStack_10;
  unsigned_short aInteger_local;
  
  local_12 = aInteger;
  psStack_10 = __return_storage_ptr__;
  utils::Encode<unsigned_short>((ByteArray *)&local_50,aInteger);
  utils::Hex_abi_cxx11_(&local_38,(utils *)&local_50,aBytes);
  std::operator+(__return_storage_ptr__,"0x",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToHex(T aInteger)
{
    return "0x" + utils::Hex(utils::Encode(aInteger));
}